

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_execute_script_step_one_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Wrapper *pAVar4;
  Am_Object local_98;
  Am_Object local_90;
  undefined1 local_88 [8];
  Am_Value_List new_value;
  undefined1 local_70 [8];
  Am_Value_List all_cmds;
  Am_Object script_cmd;
  Am_Object line;
  undefined1 local_48 [8];
  Am_Value_List sel_cmds;
  Am_Object execute_cmd;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object script_window;
  Am_Object *cmd_local;
  
  script_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&sel_cmds.item,pAVar2);
  Am_Object::Get_Object(&line,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get(&line,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar2);
  Am_Object::~Am_Object(&line);
  Am_Object::Am_Object(&script_cmd);
  Am_Object::Am_Object((Am_Object *)&all_cmds.item);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_48);
  if (bVar1) {
    Am_Value_List::Start((Am_Value_List *)local_48);
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_48);
    Am_Object::operator=(&script_cmd,pAVar2);
    pAVar2 = Am_Object::Get(&script_cmd,0xc5,0);
    Am_Object::operator=((Am_Object *)&all_cmds.item,pAVar2);
  }
  do_execute_script((Am_Object *)&sel_cmds.item,true,(Am_Object *)&all_cmds.item);
  Am_Object::Get_Object
            ((Am_Object *)&new_value.item,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar2 = Am_Object::Get((Am_Object *)&new_value.item,0xa2,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_70,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&new_value.item);
  Am_Value_List::Start((Am_Value_List *)local_70);
  bVar1 = Am_Object::Valid(&script_cmd);
  if (bVar1) {
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&script_cmd);
    bVar1 = Am_Value_List::Member((Am_Value_List *)local_70,pAVar4);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"Line ");
      poVar3 = operator<<(poVar3,&script_cmd);
      poVar3 = std::operator<<(poVar3," lost from ");
      poVar3 = operator<<(poVar3,&local_18);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
  }
  Am_Value_List::Next((Am_Value_List *)local_70);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_88);
  bVar1 = Am_Value_List::Last((Am_Value_List *)local_70);
  if (!bVar1) {
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_70);
    Am_Value_List::Add((Am_Value_List *)local_88,pAVar2,Am_TAIL,true);
  }
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"--One_step; Setting value of ");
    Am_Object::Get_Object(&local_90,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_SCROLL_GROUP);
    poVar3 = operator<<(poVar3,&local_90);
    poVar3 = std::operator<<(poVar3," to be ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_88);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    Am_Object::~Am_Object(&local_90);
  }
  Am_Object::Get_Object(&local_98,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_88);
  Am_Object::Set(&local_98,0x169,pAVar4,0);
  Am_Object::~Am_Object(&local_98);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_88);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_70);
  Am_Object::~Am_Object((Am_Object *)&all_cmds.item);
  Am_Object::~Am_Object(&script_cmd);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_cmds.item);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_execute_script_step_one,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object execute_cmd = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List sel_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object line, script_cmd;
  if (sel_cmds.Valid()) {
    sel_cmds.Start();
    line = sel_cmds.Get();
    script_cmd = line.Get(Am_COMMAND);
  }
  do_execute_script(execute_cmd, true, script_cmd);
  Am_Value_List all_cmds =
      script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_ITEMS);
  all_cmds.Start();
  if (line.Valid()) {
    if (!all_cmds.Member(line))
      Am_ERROR("Line " << line << " lost from " << script_window);
  }
  //pointer is at line
  all_cmds.Next();
  Am_Value_List new_value;
  if (!all_cmds.Last()) { // otherwise, went past end, leave new_value null
    new_value.Add(all_cmds.Get());
  }
  if (am_sdebug)
    std::cout << "--One_step; Setting value of "
              << script_window.Get_Object(Am_UNDO_SCROLL_GROUP) << " to be "
              << new_value << std::endl
              << std::flush;
  script_window.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_VALUE, new_value);
}